

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O3

size_t __thiscall
MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
resize(DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *this,
      size_t new_size)

{
  unit_t *__src;
  uchar *__src_00;
  unit_t *__dest;
  uchar *__dest_00;
  ulong __n;
  
  __src = this->array_;
  __n = this->alloc_size_;
  __dest = (unit_t *)operator_new__(-(ulong)(new_size >> 0x3d != 0) | new_size * 8);
  if (__n != 0) {
    memcpy(__dest,__src,__n * 8);
  }
  if (__n < new_size) {
    memset(__dest + __n,0,new_size * 8 + __n * -8);
  }
  if (__src != (unit_t *)0x0) {
    operator_delete__(__src);
    __n = this->alloc_size_;
  }
  this->array_ = __dest;
  __src_00 = this->used_;
  __dest_00 = (uchar *)operator_new__(new_size);
  if (__n != 0) {
    memcpy(__dest_00,__src_00,__n);
  }
  if (__n <= new_size && new_size - __n != 0) {
    memset(__dest_00 + __n,0,new_size - __n);
  }
  if (__src_00 != (uchar *)0x0) {
    operator_delete__(__src_00);
  }
  this->used_ = __dest_00;
  this->alloc_size_ = new_size;
  return new_size;
}

Assistant:

size_t resize(const size_t new_size) {
    unit_t tmp;
    tmp.base = 0;
    tmp.check = 0;
    array_ = _resize(array_, alloc_size_, new_size, tmp);
    used_  = _resize(used_, alloc_size_, new_size,
                     static_cast<unsigned char>(0));
    alloc_size_ = new_size;
    return new_size;
  }